

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O3

string * __thiscall
QPDFFormFieldObjectHelper::getDefaultAppearance_abi_cxx11_
          (string *__return_storage_ptr__,QPDFFormFieldObjectHelper *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 this_00;
  element_type *peVar2;
  bool bVar3;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  element_type *peStack_30;
  
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10);
  local_58._0_8_ = p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_68 + 0x10),"/DA","");
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)local_68,(string *)this);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._0_8_ != p_Var1) {
    operator_delete((void *)local_58._0_8_,
                    (ulong)((long)(_func_int ***)local_48._vptr__Sp_counted_base + 1));
  }
  bVar3 = QPDFObjectHandle::isString((QPDFObjectHandle *)local_68);
  if (!bVar3) {
    local_58._0_8_ = p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_68 + 0x10),"/DA","");
    getFieldFromAcroForm((QPDFFormFieldObjectHelper *)&local_38,(string *)this);
    peVar2 = peStack_30;
    local_68._0_8_ = local_38._M_pi;
    this_00 = local_68._8_8_;
    local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peStack_30 = (element_type *)0x0;
    local_68._8_8_ = peVar2;
    if ((element_type *)this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      if (peStack_30 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_30);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._0_8_ != p_Var1) {
      operator_delete((void *)local_58._0_8_,
                      (ulong)((long)(_func_int ***)local_48._vptr__Sp_counted_base + 1));
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar3 = QPDFObjectHandle::isString((QPDFObjectHandle *)local_68);
  if (bVar3) {
    QPDFObjectHandle::getUTF8Value_abi_cxx11_
              ((string *)(local_68 + 0x10),(QPDFObjectHandle *)local_68);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_68 + 0x10));
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._0_8_ != p_Var1) {
      operator_delete((void *)local_58._0_8_,
                      (ulong)((long)(_func_int ***)local_48._vptr__Sp_counted_base + 1));
    }
  }
  if ((element_type *)local_68._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFFormFieldObjectHelper::getDefaultAppearance()
{
    auto value = getInheritableFieldValue("/DA");
    bool looked_in_acroform = false;
    if (!value.isString()) {
        value = getFieldFromAcroForm("/DA");
        looked_in_acroform = true;
    }
    std::string result;
    if (value.isString()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper DA present", looked_in_acroform ? 0 : 1);
        result = value.getUTF8Value();
    }
    return result;
}